

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool GEO::Process::os_enable_FPE(bool flag)

{
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,flag) == 0) {
    fedisableexcept(0x1d);
  }
  else {
    feenableexcept(0x1d);
  }
  return true;
}

Assistant:

bool os_enable_FPE(bool flag) {
#ifdef GEO_OS_APPLE
/*	    
           unsigned int excepts = 0
                // | _MM_MASK_INEXACT   // inexact result
                   | _MM_MASK_DIV_ZERO  // division by zero
                   | _MM_MASK_UNDERFLOW // result not representable due to underflow
                   | _MM_MASK_OVERFLOW  // result not representable due to overflow
                   | _MM_MASK_INVALID   // invalid operation
                   ;
*/
            // _MM_SET_EXCEPTION_MASK(_MM_GET_EXCEPTION_MASK() & ~excepts);
            geo_argused(flag);
//          geo_argused(excepts);
            return true;
#else
            int excepts = 0
                // | FE_INEXACT     // inexact result
                   | FE_DIVBYZERO   // division by zero
                   | FE_UNDERFLOW   // result not representable due to underflow
                   | FE_OVERFLOW    // result not representable due to overflow
                   | FE_INVALID     // invalid operation
                   ;
#ifdef GEO_OS_EMSCRIPTEN
            geo_argused(flag);
            geo_argused(excepts);
#else            
            if(flag) {
                feenableexcept(excepts);
            } else {
                fedisableexcept(excepts);
            }
#endif            
            return true;
#endif
        }